

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O0

char * mp_decode_ext(char **data,int8_t *type,uint32_t *len)

{
  char *pcVar1;
  uint32_t uVar2;
  char *str;
  uint32_t *len_local;
  int8_t *type_local;
  char **data_local;
  
  if (len != (uint32_t *)0x0) {
    uVar2 = mp_decode_extl(data,type);
    *len = uVar2;
    pcVar1 = *data;
    *data = *data + *len;
    return pcVar1;
  }
  __assert_fail("len != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/msgpuck.h",
                0x86f,"const char *mp_decode_ext(const char **, int8_t *, uint32_t *)");
}

Assistant:

MP_IMPL const char *
mp_decode_ext(const char **data, int8_t *type, uint32_t *len) {
	assert(len != NULL);

	*len = mp_decode_extl(data, type);
	const char *str = *data;
	*data += *len;
	return str;
}